

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void acc_stat_highbd_win5_one_line_avx2
               (uint16_t *dgd,uint16_t *src,int h_start,int h_end,int dgd_stride,__m256i *shuffle,
               int32_t *sumX,int32_t (*sumY) [5],int64_t (*M_int) [5],int64_t (*H_int) [40])

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint in_ECX;
  int iVar10;
  long lVar11;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int64_t *in_R9;
  int *in_stack_00000008;
  uint16_t D1_1;
  int64_t *H__1;
  uint16_t *dgd_ijk_1;
  uint16_t *dgd_ij_1;
  uint16_t X1_1;
  __m256i dgd_ijkl;
  uint16_t D2;
  uint16_t D1;
  int64_t *H_;
  uint16_t *dgd_ijk;
  uint16_t *dgd_ij;
  uint16_t X2;
  uint16_t X1;
  int has_odd_pixel;
  int h_end_even;
  int wiener_win;
  int l;
  int k;
  int j;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  
  uVar12 = 5;
  uVar6 = in_ECX & 0xfffffffe;
  uVar7 = in_ECX & 1;
  for (; in_EDX < (int)uVar6; in_EDX = in_EDX + 2) {
    uVar1 = *(ushort *)(in_RSI + (long)in_EDX * 2);
    uVar2 = *(ushort *)(in_RSI + (long)(in_EDX + 1) * 2);
    *in_stack_00000008 = (uint)uVar1 + (uint)uVar2 + *in_stack_00000008;
    lVar11 = (long)in_EDX;
    for (iVar14 = 0; iVar14 < 5; iVar14 = iVar14 + 1) {
      lVar9 = in_RDI + lVar11 * 2 + (long)(iVar14 * in_R8D) * 2;
      for (iVar13 = 0; iVar13 < 5; iVar13 = iVar13 + 1) {
        uVar3 = *(ushort *)(lVar9 + (long)iVar13 * 2);
        uVar4 = *(ushort *)(lVar9 + 2 + (long)iVar13 * 2);
        sumX[(long)iVar14 * 5 + (long)iVar13] =
             sumX[(long)iVar14 * 5 + (long)iVar13] + (uint)uVar3 + (uint)uVar4;
        *(long *)(sumY[(long)iVar14 * 2] + (long)iVar13 * 2) =
             *(long *)(sumY[(long)iVar14 * 2] + (long)iVar13 * 2) +
             (long)(int)((uint)uVar3 * (uint)uVar1 + (uint)uVar4 * (uint)uVar2);
        uVar8 = loadu_int32((void *)(lVar9 + (long)iVar13 * 2));
        auVar5 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
        auVar5 = vpinsrd_avx(auVar5,uVar8,2);
        vpinsrd_avx(auVar5,uVar8,3);
        auVar5 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
        auVar5 = vpinsrd_avx(auVar5,uVar8,2);
        vpinsrd_avx(auVar5,uVar8,3);
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
      }
    }
  }
  if (uVar7 != 0) {
    uVar1 = *(ushort *)(in_RSI + (long)in_EDX * 2);
    *in_stack_00000008 = (uint)uVar1 + *in_stack_00000008;
    lVar11 = (long)in_EDX;
    for (iVar14 = 0; iVar14 < 5; iVar14 = iVar14 + 1) {
      iVar10 = iVar14 * in_R8D;
      for (iVar13 = 0; iVar13 < 5; iVar13 = iVar13 + 1) {
        uVar2 = *(ushort *)(in_RDI + lVar11 * 2 + (long)iVar10 * 2 + (long)iVar13 * 2);
        sumX[(long)iVar14 * 5 + (long)iVar13] = sumX[(long)iVar14 * 5 + (long)iVar13] + (uint)uVar2;
        *(long *)(sumY[(long)iVar14 * 2] + (long)iVar13 * 2) =
             *(long *)(sumY[(long)iVar14 * 2] + (long)iVar13 * 2) +
             (long)(int)((uint)uVar2 * (uint)uVar1);
        uVar8 = (uint)uVar2;
        auVar5 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
        auVar5 = vpinsrd_avx(auVar5,uVar8,2);
        vpinsrd_avx(auVar5,uVar8,3);
        auVar5 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
        auVar5 = vpinsrd_avx(auVar5,uVar8,2);
        vpinsrd_avx(auVar5,uVar8,3);
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
        acc_stat_highbd_avx2
                  (in_R9,(uint16_t *)CONCAT44(in_EDX,iVar14),(__m256i *)CONCAT44(iVar13,uVar12),
                   (__m256i *)CONCAT44(uVar6,uVar7));
      }
    }
  }
  return;
}

Assistant:

static inline void acc_stat_highbd_win5_one_line_avx2(
    const uint16_t *dgd, const uint16_t *src, int h_start, int h_end,
    int dgd_stride, const __m256i *shuffle, int32_t *sumX,
    int32_t sumY[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA],
    int64_t M_int[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA],
    int64_t H_int[WIENER_WIN2_CHROMA][WIENER_WIN_CHROMA * 8]) {
  int j, k, l;
  const int wiener_win = WIENER_WIN_CHROMA;
  // Main loop handles two pixels at a time
  // We can assume that h_start is even, since it will always be aligned to
  // a tile edge + some number of restoration units, and both of those will
  // be 64-pixel aligned.
  // However, at the edge of the image, h_end may be odd, so we need to handle
  // that case correctly.
  assert(h_start % 2 == 0);
  const int h_end_even = h_end & ~1;
  const int has_odd_pixel = h_end & 1;
  for (j = h_start; j < h_end_even; j += 2) {
    const uint16_t X1 = src[j];
    const uint16_t X2 = src[j + 1];
    *sumX += X1 + X2;
    const uint16_t *dgd_ij = dgd + j;
    for (k = 0; k < wiener_win; k++) {
      const uint16_t *dgd_ijk = dgd_ij + k * dgd_stride;
      for (l = 0; l < wiener_win; l++) {
        int64_t *H_ = &H_int[(l * wiener_win + k)][0];
        const uint16_t D1 = dgd_ijk[l];
        const uint16_t D2 = dgd_ijk[l + 1];
        sumY[k][l] += D1 + D2;
        M_int[k][l] += D1 * X1 + D2 * X2;

        // Load two u16 values from dgd_ijkl combined as a u32,
        // then broadcast to 8x u32 slots of a 256
        const __m256i dgd_ijkl = _mm256_set1_epi32(loadu_int32(dgd_ijk + l));
        // dgd_ijkl = [x y x y x y x y] [x y x y x y x y] where each is a u16

        acc_stat_highbd_avx2(H_ + 0 * 8, dgd_ij + 0 * dgd_stride, shuffle,
                             &dgd_ijkl);
        acc_stat_highbd_avx2(H_ + 1 * 8, dgd_ij + 1 * dgd_stride, shuffle,
                             &dgd_ijkl);
        acc_stat_highbd_avx2(H_ + 2 * 8, dgd_ij + 2 * dgd_stride, shuffle,
                             &dgd_ijkl);
        acc_stat_highbd_avx2(H_ + 3 * 8, dgd_ij + 3 * dgd_stride, shuffle,
                             &dgd_ijkl);
        acc_stat_highbd_avx2(H_ + 4 * 8, dgd_ij + 4 * dgd_stride, shuffle,
                             &dgd_ijkl);
      }
    }
  }
  // If the width is odd, add in the final pixel
  if (has_odd_pixel) {
    const uint16_t X1 = src[j];
    *sumX += X1;
    const uint16_t *dgd_ij = dgd + j;
    for (k = 0; k < wiener_win; k++) {
      const uint16_t *dgd_ijk = dgd_ij + k * dgd_stride;
      for (l = 0; l < wiener_win; l++) {
        int64_t *H_ = &H_int[(l * wiener_win + k)][0];
        const uint16_t D1 = dgd_ijk[l];
        sumY[k][l] += D1;
        M_int[k][l] += D1 * X1;

        // The `acc_stat_highbd_avx2` function wants its input to have
        // interleaved copies of two pixels, but we only have one. However, the
        // pixels are (effectively) used as inputs to a multiply-accumulate. So
        // if we set the extra pixel slot to 0, then it is effectively ignored.
        const __m256i dgd_ijkl = _mm256_set1_epi32((int)D1);

        acc_stat_highbd_avx2(H_ + 0 * 8, dgd_ij + 0 * dgd_stride, shuffle,
                             &dgd_ijkl);
        acc_stat_highbd_avx2(H_ + 1 * 8, dgd_ij + 1 * dgd_stride, shuffle,
                             &dgd_ijkl);
        acc_stat_highbd_avx2(H_ + 2 * 8, dgd_ij + 2 * dgd_stride, shuffle,
                             &dgd_ijkl);
        acc_stat_highbd_avx2(H_ + 3 * 8, dgd_ij + 3 * dgd_stride, shuffle,
                             &dgd_ijkl);
        acc_stat_highbd_avx2(H_ + 4 * 8, dgd_ij + 4 * dgd_stride, shuffle,
                             &dgd_ijkl);
      }
    }
  }
}